

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestTokenAvailable::Run(SubprocessTestTokenAvailable *this)

{
  SubprocessSet *this_00;
  TestTokenPool *tokens;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  ExitStatus EVar4;
  Subprocess *this_01;
  ssize_t sVar5;
  size_type sVar6;
  string *__rhs;
  queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_> *this_02;
  char token;
  int fds [2];
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>((string *)fds,"ls /",(allocator<char> *)&token)
  ;
  this_01 = SubprocessSet::Add(this_00,(string *)fds,false);
  std::__cxx11::string::~string((string *)fds);
  bVar2 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x135,"(Subprocess *) 0 != subproc");
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar3 = pipe(fds);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x13c,"0u == pipe(fds)");
    if (bVar2) {
      (this->super_SubprocessTest).tokens_._fd = fds[0];
      pTVar1 = g_current_test;
      sVar5 = write(fds[1],"T",1);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar5 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0x13e,"1u == write(fds[1], \"T\", 1)");
      if (bVar2) {
        tokens = &(this->super_SubprocessTest).tokens_;
        (this->super_SubprocessTest).subprocs_.token_available_ = false;
        SubprocessSet::DoWork(this_00,&tokens->super_TokenPool);
        testing::Test::Check
                  (g_current_test,(this->super_SubprocessTest).subprocs_.token_available_,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14c,"subprocs_.IsTokenAvailable()");
        pTVar1 = g_current_test;
        this_02 = &(this->super_SubprocessTest).subprocs_.finished_;
        sVar6 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size(&this_02->c);
        testing::Test::Check
                  (pTVar1,sVar6 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14d,"0u == subprocs_.finished_.size()");
        pTVar1 = g_current_test;
        sVar5 = read(fds[0],&token,1);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar5 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0x152,"1u == read(fds[0], &token, 1)");
        if (bVar2) {
          while (bVar2 = Subprocess::Done(this_01), !bVar2) {
            SubprocessSet::DoWork(this_00,&tokens->super_TokenPool);
          }
          close(fds[1]);
          close(fds[0]);
          pTVar1 = g_current_test;
          EVar4 = Subprocess::Finish(this_01);
          testing::Test::Check
                    (pTVar1,EVar4 == ExitSuccess,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15e,"ExitSuccess == subproc->Finish()");
          pTVar1 = g_current_test;
          __rhs = Subprocess::GetOutput_abi_cxx11_(this_01);
          bVar2 = std::operator!=("",__rhs);
          testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15f,"\"\" != subproc->GetOutput()");
          pTVar1 = g_current_test;
          sVar6 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size(&this_02->c);
          testing::Test::Check
                    (pTVar1,sVar6 == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x161,"1u == subprocs_.finished_.size()");
          return;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, TokenAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 1 token
#ifdef _WIN32
  tokens_._token_available = true;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
  ASSERT_EQ(1u, write(fds[1], "T", 1));
#endif

  subprocs_.ResetTokenAvailable();
  subprocs_.DoWork(&tokens_);
#ifdef _WIN32
  tokens_._token_available = false;
  // we need to loop here as we have no conrol where the token
  // I/O completion post ends up in the queue
  while (!subproc->Done() && !subprocs_.IsTokenAvailable()) {
    subprocs_.DoWork(&tokens_);
  }
#endif

  EXPECT_TRUE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(0u, subprocs_.finished_.size());

  // remove token to let DoWork() wait for command again
#ifndef _WIN32
  char token;
  ASSERT_EQ(1u, read(fds[0], &token, 1));
#endif

  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}